

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall UnifiedRegex::CharSet<char16_t>::Sort(CharSet<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint local_20;
  uint local_1c;
  int k;
  uint j;
  uint curr;
  uint i;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x372,"(IsCompact())","IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  j = 1;
  do {
    uVar3 = GetCompactLength(this);
    if (uVar3 <= j) {
      return;
    }
    uVar3 = GetCompactCharU(this,j);
    local_1c = 0;
    while( true ) {
      if (j <= local_1c) goto LAB_0150c13a;
      uVar4 = GetCompactCharU(this,local_1c);
      if (uVar3 < uVar4) break;
      local_1c = local_1c + 1;
    }
    for (local_20 = j; (int)local_1c < (int)local_20; local_20 = local_20 - 1) {
      uVar4 = GetCompactCharU(this,local_20 - 1);
      ReplaceCompactCharU(this,local_20,uVar4);
    }
    ReplaceCompactCharU(this,local_1c,uVar3);
LAB_0150c13a:
    j = j + 1;
  } while( true );
}

Assistant:

void CharSet<char16>::Sort()
    {
        Assert(IsCompact());
        __assume(this->GetCompactLength() <= MaxCompact);
        for (uint i = 1; i < this->GetCompactLength(); i++)
        {
            uint curr = GetCompactCharU(i);
            for (uint j = 0; j < i; j++)
            {
                if (GetCompactCharU(j) > curr)
                {
                    for (int k = i; k > (int)j; k--)
                    {
                        this->ReplaceCompactCharU(k, this->GetCompactCharU(k - 1));
                    }
                    this->ReplaceCompactCharU(j, curr);
                    break;
                }
            }
        }
    }